

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

int dsa_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  BIGNUM **out;
  undefined8 *puVar1;
  int iVar2;
  
  out = (BIGNUM **)to->pkey;
  puVar1 = (undefined8 *)from->pkey;
  iVar2 = dup_bn_into(out,(BIGNUM *)*puVar1);
  if (iVar2 != 0) {
    iVar2 = dup_bn_into(out + 1,(BIGNUM *)puVar1[1]);
    if (iVar2 != 0) {
      iVar2 = dup_bn_into(out + 2,(BIGNUM *)puVar1[2]);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

static int dsa_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from) {
  DSA *to_dsa = reinterpret_cast<DSA *>(to->pkey);
  const DSA *from_dsa = reinterpret_cast<const DSA *>(from->pkey);
  if (!dup_bn_into(&to_dsa->p, from_dsa->p) ||
      !dup_bn_into(&to_dsa->q, from_dsa->q) ||
      !dup_bn_into(&to_dsa->g, from_dsa->g)) {
    return 0;
  }

  return 1;
}